

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool __thiscall QStyleSheetBorderData::isOpaque(QStyleSheetBorderData *this)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar4;
  int local_24;
  QSize *this_00;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  this_00 = in_RDI;
  do {
    if (3 < local_24) {
      bVar2 = ::operator!=((QSharedDataPointer<QStyleSheetBorderImageData> *)in_RDI,
                           (nullptr_t *)
                           CONCAT17(in_stack_ffffffffffffffcf,
                                    CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)));
      bVar4 = 0;
      if (bVar2) {
        QSharedDataPointer<QStyleSheetBorderImageData>::operator->
                  ((QSharedDataPointer<QStyleSheetBorderImageData> *)0x44ce54);
        bVar4 = QPixmap::hasAlpha();
      }
      if ((bVar4 & 1) == 0) {
        local_11 = true;
      }
      else {
        local_11 = false;
      }
LAB_0044ce7a:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_11;
    }
    if ((*(int *)((long)&((totally_ordered_wrapper<QStyleSheetBorderImageData_*> *)&in_RDI[7].wd)->
                         ptr + (long)local_24 * 4) != 0xc) &&
       (*(int *)((long)&((totally_ordered_wrapper<QStyleSheetBorderImageData_*> *)&in_RDI[7].wd)->
                        ptr + (long)local_24 * 4) != 1)) {
      if ((1 < *(int *)((long)&((totally_ordered_wrapper<QStyleSheetBorderImageData_*> *)
                               &in_RDI[7].wd)->ptr + (long)local_24 * 4)) &&
         ((*(int *)((long)&((totally_ordered_wrapper<QStyleSheetBorderImageData_*> *)&in_RDI[7].wd)
                           ->ptr + (long)local_24 * 4) < 8 &&
          (*(int *)((long)&((totally_ordered_wrapper<QStyleSheetBorderImageData_*> *)&in_RDI[7].wd)
                           ->ptr + (long)local_24 * 4) != 4)))) {
        local_11 = false;
        goto LAB_0044ce7a;
      }
      uVar3 = QBrush::isOpaque();
      if ((uVar3 & 1) == 0) {
        local_11 = false;
        goto LAB_0044ce7a;
      }
      bVar2 = QSize::isEmpty(this_00);
      if (!bVar2) {
        local_11 = false;
        goto LAB_0044ce7a;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool isOpaque() const
    {
        for (int i = 0; i < 4; i++) {
            if (styles[i] == QCss::BorderStyle_Native || styles[i] == QCss::BorderStyle_None)
                continue;
            if (styles[i] >= QCss::BorderStyle_Dotted && styles[i] <= QCss::BorderStyle_DotDotDash
                && styles[i] != BorderStyle_Solid)
                return false;
            if (!colors[i].isOpaque())
                return false;
            if (!radii[i].isEmpty())
                return false;
        }
        if (bi != nullptr && bi->pixmap.hasAlpha())
            return false;
        return true;
    }